

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

int __thiscall QDataWidgetMapperPrivate::itemCount(QDataWidgetMapperPrivate *this)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QModelIndex *__return_storage_ptr__;
  long in_FS_OFFSET;
  bool bVar3;
  QModelIndex local_50;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = this->orientation != Horizontal;
  pQVar1 = this->model;
  __return_storage_ptr__ = &local_50;
  if (!bVar3) {
    __return_storage_ptr__ = &local_38;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,&this->rootIndex);
  iVar2 = (**(code **)(*(long *)pQVar1 + 0x78 + (ulong)bVar3 * 8))(pQVar1,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline int itemCount()
    {
        return orientation == Qt::Horizontal
            ? model->rowCount(rootIndex)
            : model->columnCount(rootIndex);
    }